

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_encoder.hpp
# Opt level: O1

void __thiscall
jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::
write_utf8_string(basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *this,
                 string_view *sv)

{
  binary_stream_sink *this_00;
  ulong uVar1;
  size_t sVar2;
  char *pcVar3;
  byte ch;
  uint8_t buf [1];
  uint uVar4;
  size_t sVar5;
  long lVar6;
  uint8_t buf_1 [2];
  uint8_t buf_3 [4];
  uint8_t buf_2 [8];
  ushort local_2e;
  uint local_2c;
  ulong local_28;
  
  uVar1 = sv->_M_len;
  ch = (byte)uVar1;
  if (uVar1 < 0x18) {
    ch = ch | 0x60;
  }
  else {
    if (0xff < uVar1) {
      if (uVar1 < 0x10000) {
        binary_stream_sink::push_back(&this->sink_,'y');
        local_2e = (ushort)uVar1 << 8 | (ushort)uVar1 >> 8;
        lVar6 = 0;
        do {
          binary_stream_sink::push_back(&this->sink_,*(uint8_t *)((long)&local_2e + lVar6));
          lVar6 = lVar6 + 1;
        } while (lVar6 != 2);
      }
      else {
        this_00 = &this->sink_;
        if (uVar1 >> 0x20 == 0) {
          binary_stream_sink::push_back(this_00,'z');
          uVar4 = (uint)uVar1;
          local_2c = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18
          ;
          lVar6 = 0;
          do {
            binary_stream_sink::push_back(this_00,*(uint8_t *)((long)&local_2c + lVar6));
            lVar6 = lVar6 + 1;
          } while (lVar6 != 4);
        }
        else {
          binary_stream_sink::push_back(this_00,'{');
          local_28 = uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 |
                     (uVar1 & 0xff0000000000) >> 0x18 | (uVar1 & 0xff00000000) >> 8 |
                     (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 |
                     (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38;
          lVar6 = 0;
          do {
            binary_stream_sink::push_back(this_00,*(uint8_t *)((long)&local_28 + lVar6));
            lVar6 = lVar6 + 1;
          } while (lVar6 != 8);
        }
      }
      goto LAB_0029342e;
    }
    binary_stream_sink::push_back(&this->sink_,'x');
  }
  binary_stream_sink::push_back(&this->sink_,ch);
LAB_0029342e:
  sVar2 = sv->_M_len;
  if (sVar2 != 0) {
    pcVar3 = sv->_M_str;
    sVar5 = 0;
    do {
      binary_stream_sink::push_back(&this->sink_,pcVar3[sVar5]);
      sVar5 = sVar5 + 1;
    } while (sVar2 != sVar5);
  }
  return;
}

Assistant:

void write_utf8_string(const string_view& sv)
    {
        const size_t length = sv.size();

        if (length <= 0x17)
        {
            // fixstr stores a byte array whose length is upto 31 bytes
            binary::native_to_big(static_cast<uint8_t>(0x60 + length), 
                                            std::back_inserter(sink_));
        }
        else if (length <= 0xff)
        {
            binary::native_to_big(static_cast<uint8_t>(0x78), 
                                            std::back_inserter(sink_));
            binary::native_to_big(static_cast<uint8_t>(length), 
                                            std::back_inserter(sink_));
        }
        else if (length <= 0xffff)
        {
            binary::native_to_big(static_cast<uint8_t>(0x79), 
                                            std::back_inserter(sink_));
            binary::native_to_big(static_cast<uint16_t>(length), 
                                            std::back_inserter(sink_));
        }
        else if (length <= 0xffffffff)
        {
            binary::native_to_big(static_cast<uint8_t>(0x7a), 
                                            std::back_inserter(sink_));
            binary::native_to_big(static_cast<uint32_t>(length), 
                                            std::back_inserter(sink_));
        }
        else if (uint64_t(length) <= (std::numeric_limits<std::uint64_t>::max)())
        {
            binary::native_to_big(static_cast<uint8_t>(0x7b), 
                                            std::back_inserter(sink_));
            binary::native_to_big(static_cast<uint64_t>(length), 
                                            std::back_inserter(sink_));
        }

        for (auto c : sv)
        {
            sink_.push_back(c);
        }
    }